

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.h
# Opt level: O0

string * __thiscall aeron::Context::cncFileName_abi_cxx11_(Context *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,in_RSI,"/");
  std::operator+(in_RDI,&local_30,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CncFileDescriptor::CNC_FILE_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_30);
  return in_RDI;
}

Assistant:

inline const std::string cncFileName()
    {
        return m_dirName + "/" + CncFileDescriptor::CNC_FILE;
    }